

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int attr_counter_set_collect(mtree_writer *mtree,mtree_entry_conflict *me)

{
  int iVar1;
  mtree_entry_conflict *me_00;
  attr_counter *paVar2;
  mtree_entry_conflict *pmVar3;
  attr_counter **in_RSI;
  long in_RDI;
  int keys;
  att_counter_set *acs;
  attr_counter *last;
  attr_counter *ac;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  attr_counter *paVar5;
  mtree_entry_conflict *ac_00;
  
  me_00 = (mtree_entry_conflict *)(in_RDI + 0xb8);
  uVar4 = *(uint *)(in_RDI + 0xf0);
  if ((uVar4 & 0x300000) != 0) {
    if ((me_00->rbnode).rb_nodes[0] == (archive_rb_node *)0x0) {
      paVar2 = attr_counter_new(me_00,(attr_counter *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      (me_00->rbnode).rb_nodes[0] = (archive_rb_node *)paVar2;
      if ((me_00->rbnode).rb_nodes[0] == (archive_rb_node *)0x0) {
        return -1;
      }
    }
    else {
      paVar2 = (attr_counter *)0x0;
      paVar5 = (attr_counter *)(me_00->rbnode).rb_nodes[0];
      while ((paVar5 != (attr_counter *)0x0 &&
             ((attr_counter *)paVar5->m_entry->uid != in_RSI[0x1f]))) {
        paVar2 = paVar5;
        paVar5 = paVar5->next;
      }
      iVar1 = attr_counter_inc(in_RSI,paVar5,paVar2,me_00);
      if (iVar1 < 0) {
        return -1;
      }
    }
  }
  if ((uVar4 & 0x30) != 0) {
    if ((me_00->rbnode).rb_nodes[1] == (archive_rb_node *)0x0) {
      paVar2 = attr_counter_new(me_00,(attr_counter *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      (me_00->rbnode).rb_nodes[1] = (archive_rb_node *)paVar2;
      if ((me_00->rbnode).rb_nodes[1] == (archive_rb_node *)0x0) {
        return -1;
      }
    }
    else {
      paVar2 = (attr_counter *)0x0;
      paVar5 = (attr_counter *)(me_00->rbnode).rb_nodes[1];
      while ((paVar5 != (attr_counter *)0x0 &&
             ((attr_counter *)paVar5->m_entry->gid != in_RSI[0x20]))) {
        paVar2 = paVar5;
        paVar5 = paVar5->next;
      }
      iVar1 = attr_counter_inc(in_RSI,paVar5,paVar2,me_00);
      if (iVar1 < 0) {
        return -1;
      }
    }
  }
  if ((uVar4 & 0x200) != 0) {
    if ((me_00->rbnode).rb_info == 0) {
      paVar2 = attr_counter_new(me_00,(attr_counter *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      (me_00->rbnode).rb_info = (uintptr_t)paVar2;
      if ((me_00->rbnode).rb_info == 0) {
        return -1;
      }
    }
    else {
      paVar2 = (attr_counter *)0x0;
      paVar5 = (attr_counter *)(me_00->rbnode).rb_info;
      while ((paVar5 != (attr_counter *)0x0 && (paVar5->m_entry->mode != *(mode_t *)(in_RSI + 0x1d))
             )) {
        paVar2 = paVar5;
        paVar5 = paVar5->next;
      }
      iVar1 = attr_counter_inc(in_RSI,paVar5,paVar2,me_00);
      if (iVar1 < 0) {
        return -1;
      }
    }
  }
  if ((uVar4 & 8) != 0) {
    if (me_00->next == (mtree_entry_conflict *)0x0) {
      pmVar3 = (mtree_entry_conflict *)
               attr_counter_new(me_00,(attr_counter *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      me_00->next = pmVar3;
      if (me_00->next == (mtree_entry_conflict *)0x0) {
        return -1;
      }
    }
    else {
      pmVar3 = (mtree_entry_conflict *)0x0;
      ac_00 = me_00->next;
      while ((ac_00 != (mtree_entry_conflict *)0x0 &&
             ((*(attr_counter **)((ac_00->rbnode).rb_info + 0x118) != in_RSI[0x23] ||
              (*(attr_counter **)((ac_00->rbnode).rb_info + 0x120) != in_RSI[0x24]))))) {
        pmVar3 = ac_00;
        ac_00 = (mtree_entry_conflict *)(ac_00->rbnode).rb_nodes[1];
      }
      iVar1 = attr_counter_inc(in_RSI,(attr_counter *)ac_00,(attr_counter *)pmVar3,me_00);
      if (iVar1 < 0) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

static int
attr_counter_set_collect(struct mtree_writer *mtree, struct mtree_entry *me)
{
	struct attr_counter *ac, *last;
	struct att_counter_set *acs = &mtree->acs;
	int keys = mtree->keys;

	if (keys & (F_UNAME | F_UID)) {
		if (acs->uid_list == NULL) {
			acs->uid_list = attr_counter_new(me, NULL);
			if (acs->uid_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->uid_list; ac; ac = ac->next) {
				if (ac->m_entry->uid == me->uid)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->uid_list, ac, last, me) < 0)
				return (-1);
		}
	}
	if (keys & (F_GNAME | F_GID)) {
		if (acs->gid_list == NULL) {
			acs->gid_list = attr_counter_new(me, NULL);
			if (acs->gid_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->gid_list; ac; ac = ac->next) {
				if (ac->m_entry->gid == me->gid)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->gid_list, ac, last, me) < 0)
				return (-1);
		}
	}
	if (keys & F_MODE) {
		if (acs->mode_list == NULL) {
			acs->mode_list = attr_counter_new(me, NULL);
			if (acs->mode_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->mode_list; ac; ac = ac->next) {
				if (ac->m_entry->mode == me->mode)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->mode_list, ac, last, me) < 0)
				return (-1);
		}
	}
	if (keys & F_FLAGS) {
		if (acs->flags_list == NULL) {
			acs->flags_list = attr_counter_new(me, NULL);
			if (acs->flags_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->flags_list; ac; ac = ac->next) {
				if (ac->m_entry->fflags_set == me->fflags_set &&
				    ac->m_entry->fflags_clear ==
							me->fflags_clear)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->flags_list, ac, last, me) < 0)
				return (-1);
		}
	}

	return (0);
}